

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

void interpolative_internal::decode_interpolative
               (bit_stream *is,uint32_t *out_buf,size_t n,size_t low,size_t high)

{
  int iVar1;
  uint32_t *puVar2;
  uint64_t uVar3;
  bit_stream *in_RCX;
  uint32_t *in_RDX;
  bit_stream *in_RSI;
  uint64_t in_R8;
  uint64_t v;
  uint64_t n2;
  uint64_t n1;
  uint64_t h;
  uint32_t *high_00;
  uint32_t *out_buf_00;
  
  if (in_RDX != (uint32_t *)0x0) {
    puVar2 = (uint32_t *)((long)in_RDX + 1U >> 1);
    iVar1 = (int)in_RCX;
    high_00 = puVar2;
    out_buf_00 = in_RDX;
    uVar3 = read_center_mid(in_RCX,in_R8);
    in_RSI->buf[(long)high_00 - 3] = (iVar1 + (int)((long)puVar2 - 1U) + (int)uVar3) - 2;
    if ((long)puVar2 - 1U != 0) {
      decode_interpolative(in_RSI,out_buf_00,(size_t)in_RCX,in_R8,(size_t)high_00);
    }
    if (in_RDX != puVar2) {
      decode_interpolative(in_RSI,out_buf_00,(size_t)in_RCX,in_R8,(size_t)high_00);
    }
  }
  return;
}

Assistant:

static inline void decode_interpolative(
        bit_stream& is, uint32_t* out_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = low + n1 - 1ULL
            + read_center_mid(is, high - n2 - low - n1 + 1ULL);

        out_buf[h - 1] = v - 1; // we don't encode 0
        if (n1)
            decode_interpolative(is, out_buf, n1, low, v - 1ULL);
        if (n2)
            decode_interpolative(is, out_buf + h, n2, v + 1ULL, high);
    }